

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O0

SQInteger array_remove(HSQUIRRELVM v)

{
  bool bVar1;
  SQInteger nidx;
  SQArray *this;
  SQObjectPtr val;
  SQObject *idx;
  SQObject *o;
  SQObjectPtr *in_stack_ffffffffffffff88;
  SQVM *in_stack_ffffffffffffff90;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  SQObjectPtr local_30;
  SQObjectPtr *local_20;
  SQObjectPtr *local_18;
  SQVM *local_8;
  
  local_18 = stack_get(in_stack_ffffffffffffff90,(SQInteger)in_stack_ffffffffffffff88);
  local_20 = stack_get(in_stack_ffffffffffffff90,(SQInteger)in_stack_ffffffffffffff88);
  if (((local_20->super_SQObject)._type & 0x4000000) == 0) {
    local_8 = (SQVM *)sq_throwerror(in_stack_ffffffffffffff90,(SQChar *)in_stack_ffffffffffffff88);
  }
  else {
    SQObjectPtr::SQObjectPtr(&local_30);
    if ((local_20->super_SQObject)._type == OT_FLOAT) {
      nidx = (SQInteger)(local_20->super_SQObject)._unVal.fFloat;
    }
    else {
      nidx = (local_20->super_SQObject)._unVal.nInteger;
    }
    bVar1 = SQArray::Get((local_18->super_SQObject)._unVal.pArray,nidx,
                         (SQObjectPtr *)
                         CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
    if (bVar1) {
      if ((local_20->super_SQObject)._type == OT_FLOAT) {
        this = (SQArray *)(long)(local_20->super_SQObject)._unVal.fFloat;
      }
      else {
        this = (local_20->super_SQObject)._unVal.pArray;
      }
      SQArray::Remove(this,(SQInteger)in_stack_ffffffffffffff90);
      SQVM::Push(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      local_8 = (SQVM *)0x1;
    }
    else {
      in_stack_ffffffffffffff90 =
           (SQVM *)sq_throwerror(in_stack_ffffffffffffff90,(SQChar *)in_stack_ffffffffffffff88);
      local_8 = in_stack_ffffffffffffff90;
    }
    SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff90);
  }
  return (SQInteger)local_8;
}

Assistant:

static SQInteger array_remove(HSQUIRRELVM v)
{
    SQObject &o = stack_get(v, 1);
    SQObject &idx = stack_get(v, 2);
    if(!sq_isnumeric(idx)) return sq_throwerror(v, _SC("wrong type"));
    SQObjectPtr val;
    if(_array(o)->Get(tointeger(idx), val)) {
        _array(o)->Remove(tointeger(idx));
        v->Push(val);
        return 1;
    }
    return sq_throwerror(v, _SC("idx out of range"));
}